

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pad-otp.c
# Opt level: O2

void pad_otp(uint32_t code,uint length,char *buf)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  char *pbuf;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  do {
    buf[uVar5] = (byte)((ulong)code % 10) | 0x30;
    uVar5 = uVar5 + 1;
    bVar2 = 9 < code;
    code = code / 10;
  } while (bVar2);
  for (; (uint)uVar5 < length; uVar5 = uVar5 + 1) {
    buf[uVar5] = '0';
  }
  buf[uVar5] = '\0';
  uVar3 = uVar5 >> 1;
  for (uVar4 = 0; uVar5 = uVar5 - 1, uVar4 < (uVar3 & 0x7fffffff); uVar4 = uVar4 + 1) {
    cVar1 = buf[uVar4];
    buf[uVar4] = buf[uVar5 & 0xffffffff];
    buf[uVar5 & 0xffffffff] = cVar1;
  }
  return;
}

Assistant:

void pad_otp(uint32_t code, unsigned length, char *buf) {
  unsigned i;
  unsigned len;
  char *pbuf = buf;

  do {
    int digit = code % 10;
    *(pbuf++) = '0' + digit;
    code /= 10;
  } while (code > 0);

  for (i = (pbuf - buf); i < length; i++) {
    *(pbuf++) = '0';
  }

  *pbuf = '\0';

  len = pbuf - buf;

  for (i = 0; i < len / 2; i++) {
    char tmp = buf[i];
    buf[i] = buf[len - i - 1];
    buf[len - i - 1] = tmp;
  }
}